

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall
kratos::DebugDatabase::save_database(DebugDatabase *this,string *filename,bool override)

{
  Module *this_00;
  pointer this_01;
  bool bVar1;
  VarType VVar2;
  element_type *peVar3;
  reference ppGVar4;
  mapped_type *this_02;
  reference __in;
  type *name;
  type *value;
  element_type *peVar5;
  element_type *var_00;
  reference ppVar6;
  reference ppSVar7;
  mapped_type *ppMVar8;
  undefined7 in_register_00000011;
  Generator *top;
  Generator *extraout_RDX;
  Generator *extraout_RDX_00;
  bool local_6f1;
  string local_678;
  undefined1 local_658 [8];
  ofstream stream;
  undefined1 local_458 [8];
  StmtScopeVisitor v_1;
  Module *mod_3;
  _Node_iterator_base<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_false> local_3a0;
  _Node_iterator_base<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_false> local_398;
  _Node_iterator_base<kratos::Generator_*,_false> local_390;
  _Node_iterator_base<kratos::Generator_*,_false> local_388;
  Generator *local_380;
  Generator *gen_3;
  Stmt *stmt;
  iterator __end1_3;
  iterator __begin1_3;
  vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *__range1_3;
  unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  visited_gens;
  pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *v;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range4;
  vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  shared_ptr<kratos::Var> var;
  type *back_name;
  type *front_name;
  _Self local_268;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  mapped_type *__range2_1;
  mapped_type *var_names;
  Module *mod_2;
  _Node_iterator_base<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
  local_238;
  Generator *local_230;
  Generator *gen_2;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  *__range1_2;
  Module *local_208;
  Module *child_mod;
  element_type *local_1f8;
  _Node_iterator_base<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_false> local_1f0;
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *local_1e8;
  shared_ptr<kratos::Generator> *child;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range2;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  children;
  Module *mod_1;
  Generator *gen_1;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  *__range1_1;
  Module *local_178;
  Module *mod;
  Generator *gen;
  iterator __end1;
  iterator __begin1;
  unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  *__range1;
  unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
  gen_mod_map;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  SymbolTable table;
  unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  breakpoint_conditions;
  bool override_local;
  string *filename_local;
  DebugDatabase *this_local;
  
  top = (Generator *)CONCAT71(in_register_00000011,override);
  if ((override) && (bVar1 = fs::exists(filename), top = extraout_RDX, bVar1)) {
    fs::remove((char *)filename);
    top = extraout_RDX_00;
  }
  compute_enable_condition_abi_cxx11_
            ((unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&table.reorder_,*(kratos **)(this + 0xe8),top);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"kratos",&local_101);
  hgdb::json::SymbolTable::SymbolTable((SymbolTable *)local_e0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::
  unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
  ::unordered_map((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                   *)&__range1);
  __end1 = std::
           unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
           ::begin((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                    *)(this + 0xb0));
  gen = (Generator *)
        std::
        unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
        ::end((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
               *)(this + 0xb0));
  while (bVar1 = std::__detail::operator!=
                           (&__end1.super__Node_iterator_base<kratos::Generator_*,_false>,
                            (_Node_iterator_base<kratos::Generator_*,_false> *)&gen), bVar1) {
    ppGVar4 = std::__detail::_Node_iterator<kratos::Generator_*,_true,_false>::operator*(&__end1);
    mod = (Module *)*ppGVar4;
    local_178 = hgdb::json::SymbolTable::add_module
                          ((SymbolTable *)local_e0,&((Generator *)mod)->name);
    std::
    unordered_map<kratos::Generator*,hgdb::json::Module*,std::hash<kratos::Generator*>,std::equal_to<kratos::Generator*>,std::allocator<std::pair<kratos::Generator*const,hgdb::json::Module*>>>
    ::emplace<kratos::Generator*&,hgdb::json::Module*&>
              ((unordered_map<kratos::Generator*,hgdb::json::Module*,std::hash<kratos::Generator*>,std::equal_to<kratos::Generator*>,std::allocator<std::pair<kratos::Generator*const,hgdb::json::Module*>>>
                *)&__range1,(Generator **)&mod,&local_178);
    std::__detail::_Node_iterator<kratos::Generator_*,_true,_false>::operator++(&__end1);
  }
  __end1_1 = std::
             unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
             ::begin((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                      *)(this + 0xb0));
  gen_1 = (Generator *)
          std::
          unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
          ::end((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                 *)(this + 0xb0));
  while (bVar1 = std::__detail::operator!=
                           (&__end1_1.super__Node_iterator_base<kratos::Generator_*,_false>,
                            (_Node_iterator_base<kratos::Generator_*,_false> *)&gen_1), bVar1) {
    ppGVar4 = std::__detail::_Node_iterator<kratos::Generator_*,_true,_false>::operator*(&__end1_1);
    mod_1 = (Module *)*ppGVar4;
    ppMVar8 = std::
              unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
              ::at((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                    *)&__range1,(key_type *)&mod_1);
    children.
    super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppMVar8;
    Generator::get_child_generators
              ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)&__range2,(Generator *)mod_1);
    __end2 = std::
             vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
             ::begin((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      *)&__range2);
    child = (shared_ptr<kratos::Generator> *)
            std::
            vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
            ::end((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                                       *)&child), bVar1) {
      local_1e8 = &__gnu_cxx::
                   __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                   ::operator*(&__end2)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
      local_1f8 = std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get(local_1e8);
      local_1f0._M_cur =
           (__node_type *)
           std::
           unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
           ::find((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                   *)&__range1,&local_1f8);
      child_mod = (Module *)
                  std::
                  unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                  ::end((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                         *)&__range1);
      bVar1 = std::__detail::operator==
                        (&local_1f0,
                         (_Node_iterator_base<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_false>
                          *)&child_mod);
      if (!bVar1) {
        __range1_2 = (unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                      *)std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get
                                  (local_1e8);
        ppMVar8 = std::
                  unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                  ::at((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                        *)&__range1,(key_type *)&__range1_2);
        this_01 = children.
                  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_208 = *ppMVar8;
        peVar3 = std::
                 __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1e8);
        hgdb::json::Module::add_instance((Module *)this_01,&peVar3->instance_name,local_208);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               *)&__range2);
    std::__detail::_Node_iterator<kratos::Generator_*,_true,_false>::operator++(&__end1_1);
  }
  __end1_2 = std::
             unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
             ::begin((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                      *)(this + 0xb0));
  gen_2 = (Generator *)
          std::
          unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
          ::end((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                 *)(this + 0xb0));
  do {
    bVar1 = std::__detail::operator!=
                      (&__end1_2.super__Node_iterator_base<kratos::Generator_*,_false>,
                       (_Node_iterator_base<kratos::Generator_*,_false> *)&gen_2);
    if (!bVar1) {
      std::
      unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
      ::unordered_set((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                       *)&__range1_3);
      __end1_3 = std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::begin
                           ((vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)
                            this);
      stmt = (Stmt *)std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::end
                               ((vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>
                                 *)this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_3,
                                (__normal_iterator<const_kratos::Stmt_**,_std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>_>
                                 *)&stmt), bVar1) {
        ppSVar7 = __gnu_cxx::
                  __normal_iterator<const_kratos::Stmt_**,_std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>_>
                  ::operator*(&__end1_3);
        gen_3 = (Generator *)*ppSVar7;
        local_380 = Stmt::generator_parent((Stmt *)gen_3);
        local_6f1 = true;
        if (local_380 != (Generator *)0x0) {
          local_388._M_cur =
               (__node_type *)
               std::
               unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
               ::find((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                       *)&__range1_3,&local_380);
          local_390._M_cur =
               (__node_type *)
               std::
               unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
               ::end((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                      *)&__range1_3);
          local_6f1 = std::__detail::operator!=(&local_388,&local_390);
        }
        if (local_6f1 == false) {
          local_398._M_cur =
               (__node_type *)
               std::
               unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
               ::find((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                       *)&__range1,&local_380);
          local_3a0._M_cur =
               (__node_type *)
               std::
               unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
               ::end((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                      *)&__range1);
          bVar1 = std::__detail::operator==(&local_398,&local_3a0);
          if (!bVar1) {
            std::
            unordered_set<kratos::Generator*,std::hash<kratos::Generator*>,std::equal_to<kratos::Generator*>,std::allocator<kratos::Generator*>>
            ::emplace<kratos::Generator*&>
                      ((unordered_set<kratos::Generator*,std::hash<kratos::Generator*>,std::equal_to<kratos::Generator*>,std::allocator<kratos::Generator*>>
                        *)&__range1_3,&local_380);
            ppMVar8 = std::
                      unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                      ::at((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                            *)&__range1,&local_380);
            v_1.enable_conditions_ =
                 (unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)*ppMVar8;
            StmtScopeVisitor::StmtScopeVisitor
                      ((StmtScopeVisitor *)local_458,(Module *)v_1.enable_conditions_,local_380,
                       (map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                        *)(this + 0x18),
                       (unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&table.reorder_);
            IRVisitor::visit_content((IRVisitor *)local_458,local_380);
            StmtScopeVisitor::~StmtScopeVisitor((StmtScopeVisitor *)local_458);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_kratos::Stmt_**,_std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>_>
        ::operator++(&__end1_3);
      }
      hgdb::json::SymbolTable::compress((SymbolTable *)local_e0);
      hgdb::json::SymbolTable::disable_reorder((SymbolTable *)local_e0);
      std::ofstream::ofstream(local_658);
      std::ofstream::open((string *)local_658,(_Ios_Openmode)filename);
      hgdb::json::SymbolTable::output_abi_cxx11_(&local_678,(SymbolTable *)local_e0);
      std::operator<<((ostream *)local_658,(string *)&local_678);
      std::__cxx11::string::~string((string *)&local_678);
      std::ofstream::close();
      std::ofstream::~ofstream(local_658);
      std::
      unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
      ::~unordered_set((unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                        *)&__range1_3);
      std::
      unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
      ::~unordered_map((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                        *)&__range1);
      hgdb::json::SymbolTable::~SymbolTable((SymbolTable *)local_e0);
      std::
      unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_map((unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&table.reorder_);
      return;
    }
    ppGVar4 = std::__detail::_Node_iterator<kratos::Generator_*,_true,_false>::operator*(&__end1_2);
    local_230 = *ppGVar4;
    local_238._M_cur =
         (__node_type *)
         std::
         unordered_map<const_kratos::Generator_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
         ::find((unordered_map<const_kratos::Generator_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 *)(this + 0x48),&local_230);
    mod_2 = (Module *)
            std::
            unordered_map<const_kratos::Generator_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::end((unordered_map<const_kratos::Generator_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   *)(this + 0x48));
    bVar1 = std::__detail::operator==
                      (&local_238,
                       (_Node_iterator_base<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                        *)&mod_2);
    if (!bVar1) {
      ppMVar8 = std::
                unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                ::at((unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
                      *)&__range1,&local_230);
      this_00 = *ppMVar8;
      this_02 = std::
                unordered_map<const_kratos::Generator_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                ::at((unordered_map<const_kratos::Generator_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)(this + 0x48),&local_230);
      __end2_1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(this_02);
      local_268._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(this_02);
      while (bVar1 = std::operator!=(&__end2_1,&local_268), bVar1) {
        __in = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2_1);
        name = std::get<0ul,std::__cxx11::string_const,std::__cxx11::string>(__in);
        value = std::get<1ul,std::__cxx11::string_const,std::__cxx11::string>(__in);
        Generator::get_var((Generator *)
                           &vars.
                            super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_230);
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &vars.
                            super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&vars.
                                  super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          VVar2 = Var::type(peVar5);
          if (VVar2 != Base) {
            peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&vars.
                                      super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            VVar2 = Var::type(peVar5);
            if (VVar2 != PortIO) goto LAB_00341240;
          }
          var_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                              &vars.
                               super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          create_variables((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&__range4,var_00,name);
          __end4 = std::
                   vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&__range4);
          v = (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range4);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             *)&v), bVar1) {
            ppVar6 = __gnu_cxx::
                     __normal_iterator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator*(&__end4);
            hgdb::json::Variable::Variable
                      ((Variable *)&visited_gens._M_h._M_single_bucket,&ppVar6->first);
            hgdb::json::Module::add_variable
                      (this_00,(Variable *)&visited_gens._M_h._M_single_bucket);
            hgdb::json::Variable::~Variable((Variable *)&visited_gens._M_h._M_single_bucket);
            __gnu_cxx::
            __normal_iterator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator++(&__end4);
          }
          std::
          vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&__range4);
        }
        else {
LAB_00341240:
          bVar1 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)
                             &vars.
                              super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar1) {
            add_generator_static_value(this_00,name,value);
          }
        }
        std::shared_ptr<kratos::Var>::~shared_ptr
                  ((shared_ptr<kratos::Var> *)
                   &vars.
                    super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end2_1);
      }
    }
    std::__detail::_Node_iterator<kratos::Generator_*,_true,_false>::operator++(&__end1_2);
  } while( true );
}

Assistant:

void DebugDatabase::save_database(const std::string &filename, bool override) {
    if (override) {
        if (fs::exists(filename)) {
            fs::remove(filename);
        }
    }

    // compute breakpoint conditions
    auto breakpoint_conditions = compute_enable_condition(top_);
    auto table = hgdb::json::SymbolTable("kratos");

    std::unordered_map<Generator *, hgdb::json::Module *> gen_mod_map;

    // first pass to create modules
    for (auto *gen : generators_) {
        auto *mod = table.add_module(gen->name);
        gen_mod_map.emplace(gen, mod);
    }
    // second pass to add instances
    for (auto *gen : generators_) {
        auto *mod = gen_mod_map.at(gen);
        auto children = gen->get_child_generators();
        for (auto const &child : children) {
            if (gen_mod_map.find(child.get()) == gen_mod_map.end()) continue;
            auto *child_mod = gen_mod_map.at(child.get());
            mod->add_instance(child->instance_name, child_mod);
        }
    }

    // now add generator variables
    for (auto *gen : generators_) {
        if (variable_mapping_.find(gen) == variable_mapping_.end()) continue;
        auto *mod = gen_mod_map.at(gen);
        auto const &var_names = variable_mapping_.at(gen);
        for (auto const &[front_name, back_name] : var_names) {
            auto var = gen->get_var(back_name);
            if (var && (var->type() == VarType::Base || var->type() == VarType::PortIO)) {
                auto vars = create_variables(var.get(), front_name);
                for (auto const &v : vars) {
                    mod->add_variable(v.first);
                }
            } else if (!var) {
                add_generator_static_value(*mod, front_name, back_name);
            }
        }
    }

    // now deal with scopes
    std::unordered_set<Generator *> visited_gens;
    for (auto const *stmt : break_points_) {
        auto *gen = stmt->generator_parent();
        if (!gen || visited_gens.find(gen) != visited_gens.end()) continue;
        if (gen_mod_map.find(gen) == gen_mod_map.end()) continue;
        visited_gens.emplace(gen);
        auto *mod = gen_mod_map.at(gen);
        StmtScopeVisitor v(*mod, gen, stmt_mapping_, breakpoint_conditions);
        v.visit_content(gen);
    }

    // compress the table
    table.compress();

    // setting attributes
    table.disable_reorder();

    std::ofstream stream;
    stream.open(filename);
    stream << table.output();
    stream.close();
}